

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmMakefileTargetGenerator::WriteDeviceLinkRule
          (cmMakefileTargetGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *commands,string *output)

{
  cmOutputConverter *this_00;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmGeneratorTarget *pcVar2;
  pointer pcVar3;
  cmMakefile *pcVar4;
  cmLocalUnixMakefileGenerator3 *this_02;
  char *pcVar5;
  cmGeneratedFileStream *pcVar6;
  bool bVar7;
  TargetType targetType;
  int iVar8;
  string *psVar9;
  string *psVar10;
  undefined4 extraout_var;
  pointer pbVar11;
  long *plVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  pointer pbVar14;
  pointer pbVar15;
  string_view arg;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_03;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_04;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_05;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_06;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_07;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_08;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  string_view value;
  string_view separator;
  string fatbinaryOutput;
  allocator_type local_3a9;
  string objectDir;
  string linkFlags;
  string compileCmd;
  string flags;
  string architecturesStr;
  _Alloc_node __an;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  string fatbinaryOutputRel;
  string fatbinaryCommand;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linkDeps;
  string profiles;
  RuleVariables vars;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fatbinaryDepends;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cleanFiles;
  string local_c0;
  string relObjectDir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  architectures;
  string registerFile;
  cmRulePlaceholderExpander *this_03;
  
  pcVar2 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  vars.CMTargetName = (char *)&vars.TargetPDB;
  std::__cxx11::string::_M_construct<char_const*>((string *)&vars,"CUDA_ARCHITECTURES","");
  psVar9 = cmGeneratorTarget::GetSafeProperty(pcVar2,(string *)&vars);
  architecturesStr._M_dataplus._M_p = (pointer)&architecturesStr.field_2;
  pcVar3 = (psVar9->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&architecturesStr,pcVar3,pcVar3 + psVar9->_M_string_length);
  if ((char **)vars.CMTargetName != &vars.TargetPDB) {
    operator_delete(vars.CMTargetName,(ulong)(vars.TargetPDB + 1));
  }
  value._M_str = architecturesStr._M_dataplus._M_p;
  value._M_len = architecturesStr._M_string_length;
  bVar7 = cmValue::IsOff(value);
  if (bVar7) {
    pcVar4 = (this->super_cmCommonTargetGenerator).Makefile;
    vars.CMTargetName = (char *)&vars.TargetPDB;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&vars,
               "CUDA_SEPARABLE_COMPILATION on Clang requires CUDA_ARCHITECTURES to be set.","");
    cmMakefile::IssueMessage(pcVar4,FATAL_ERROR,(string *)&vars);
    if ((char **)vars.CMTargetName != &vars.TargetPDB) {
      operator_delete(vars.CMTargetName,(ulong)(vars.TargetPDB + 1));
    }
  }
  else {
    this_02 = this->LocalGenerator;
    arg._M_str = architecturesStr._M_dataplus._M_p;
    arg._M_len = architecturesStr._M_string_length;
    cmExpandedList_abi_cxx11_(&architectures,arg,false);
    psVar9 = cmLocalUnixMakefileGenerator3::GetHomeRelativeOutputPath_abi_cxx11_(this_02);
    linkDeps.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    linkDeps.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    linkDeps.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    AppendTargetDepends(this,&linkDeps,true);
    pcVar2 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
    GetConfigName_abi_cxx11_((string *)&vars,this);
    paVar1 = &objectDir.field_2;
    objectDir.field_2._M_allocated_capacity._0_4_ = 0x41445543;
    objectDir._M_string_length = 4;
    objectDir.field_2._M_allocated_capacity._4_4_ =
         objectDir.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
    objectDir._M_dataplus._M_p = (pointer)paVar1;
    cmGeneratorTarget::GetLinkDepends(pcVar2,&linkDeps,(string *)&vars,&objectDir);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)objectDir._M_dataplus._M_p != paVar1) {
      operator_delete(objectDir._M_dataplus._M_p,
                      CONCAT44(objectDir.field_2._M_allocated_capacity._4_4_,
                               objectDir.field_2._M_allocated_capacity._0_4_) + 1);
    }
    if ((char **)vars.CMTargetName != &vars.TargetPDB) {
      operator_delete(vars.CMTargetName,(ulong)(vars.TargetPDB + 1));
    }
    pbVar11 = (this->Objects).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pbVar15 = (this->Objects).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar11 != pbVar15) {
      do {
        vars.CMTargetType = (psVar9->_M_dataplus)._M_p;
        vars.CMTargetName = (char *)psVar9->_M_string_length;
        vars.TargetCompilePDB = (pbVar11->_M_dataplus)._M_p;
        vars.TargetPDB = (char *)pbVar11->_M_string_length;
        views._M_len = 2;
        views._M_array = (iterator)&vars;
        cmCatViews_abi_cxx11_(&objectDir,views);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&linkDeps,
                   &objectDir);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)objectDir._M_dataplus._M_p != paVar1) {
          operator_delete(objectDir._M_dataplus._M_p,
                          CONCAT44(objectDir.field_2._M_allocated_capacity._4_4_,
                                   objectDir.field_2._M_allocated_capacity._0_4_) + 1);
        }
        pbVar11 = pbVar11 + 1;
      } while (pbVar11 != pbVar15);
    }
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _Hashtable<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&vars,linkDeps.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
               linkDeps.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,0,&objectDir,&relObjectDir,&profiles);
    pbVar15 = linkDeps.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pbVar11 = linkDeps.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (linkDeps.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        linkDeps.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      paVar13 = &(linkDeps.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->field_2;
      do {
        plVar12 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (paVar13 + -1))->_M_dataplus)._M_p;
        if (paVar13 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar12) {
          operator_delete(plVar12,paVar13->_M_allocated_capacity + 1);
        }
        pbVar14 = (pointer)(paVar13 + 1);
        paVar13 = paVar13 + 2;
      } while (pbVar14 != pbVar15);
      linkDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar11;
    }
    if (vars.TargetPDB != (char *)0x0) {
      plVar12 = (long *)vars.TargetPDB;
      do {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&linkDeps,(value_type *)(plVar12 + 1));
        plVar12 = (long *)*plVar12;
      } while (plVar12 != (long *)0x0);
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)&vars);
    pcVar2 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
    pcVar3 = (pcVar2->ObjectDirectory)._M_dataplus._M_p;
    objectDir._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&objectDir,pcVar3,pcVar3 + (pcVar2->ObjectDirectory)._M_string_length);
    this_00 = &(this_02->super_cmLocalCommonGenerator).super_cmLocalGenerator.
               super_cmOutputConverter;
    cmOutputConverter::MaybeRelativeToCurBinDir(&relObjectDir,this_00,&objectDir);
    cleanFiles.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    cleanFiles.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    cleanFiles.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmOutputConverter::MaybeRelativeToCurBinDir((string *)&vars,this_00,output);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&cleanFiles,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vars);
    if ((char **)vars.CMTargetName != &vars.TargetPDB) {
      operator_delete(vars.CMTargetName,(ulong)(vars.TargetPDB + 1));
    }
    profiles._M_dataplus._M_p = (pointer)&profiles.field_2;
    profiles._M_string_length = 0;
    profiles.field_2._M_local_buf[0] = '\0';
    fatbinaryDepends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    fatbinaryDepends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    fatbinaryDepends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vars.CMTargetName = (char *)objectDir._M_string_length;
    vars.CMTargetType = objectDir._M_dataplus._M_p;
    vars.TargetPDB = (char *)0x15;
    vars.TargetCompilePDB = "cmake_cuda_register.h";
    views_00._M_len = 2;
    views_00._M_array = (iterator)&vars;
    cmCatViews_abi_cxx11_(&registerFile,views_00);
    if (architectures.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        architectures.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar11 = architectures.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        fatbinaryCommand._M_dataplus._M_p = (pointer)&fatbinaryCommand.field_2;
        fatbinaryCommand._M_string_length = 0;
        fatbinaryCommand.field_2._M_local_buf[0] = '\0';
        if (fatbinaryDepends.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            fatbinaryDepends.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          vars.CMTargetType = (psVar9->_M_dataplus)._M_p;
          vars.CMTargetName = (char *)psVar9->_M_string_length;
          vars.TargetPDB = (char *)relObjectDir._M_string_length;
          vars.TargetCompilePDB = relObjectDir._M_dataplus._M_p;
          vars.TargetVersionMajor = (char *)0x15;
          vars.TargetVersionMinor = "cmake_cuda_register.h";
          views_01._M_len = 3;
          views_01._M_array = (iterator)&vars;
          cmCatViews_abi_cxx11_(&fatbinaryOutput,views_01);
          vars.CMTargetName = (char *)0x1a;
          vars.CMTargetType = " --register-link-binaries=";
          vars.TargetPDB = (char *)fatbinaryOutput._M_string_length;
          vars.TargetCompilePDB = fatbinaryOutput._M_dataplus._M_p;
          views_02._M_len = 2;
          views_02._M_array = (iterator)&vars;
          cmCatViews_abi_cxx11_(&fatbinaryOutputRel,views_02);
          std::__cxx11::string::operator=((string *)&fatbinaryCommand,(string *)&fatbinaryOutputRel)
          ;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)fatbinaryOutputRel._M_dataplus._M_p != &fatbinaryOutputRel.field_2) {
            operator_delete(fatbinaryOutputRel._M_dataplus._M_p,
                            fatbinaryOutputRel.field_2._M_allocated_capacity + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&cleanFiles,&fatbinaryOutput);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)fatbinaryOutput._M_dataplus._M_p != &fatbinaryOutput.field_2) {
            operator_delete(fatbinaryOutput._M_dataplus._M_p,
                            fatbinaryOutput.field_2._M_allocated_capacity + 1);
          }
        }
        std::__cxx11::string::find((char)pbVar11,0x2d);
        std::__cxx11::string::substr((ulong)&fatbinaryOutput,(ulong)pbVar11);
        vars.CMTargetName = (char *)objectDir._M_string_length;
        vars.CMTargetType = objectDir._M_dataplus._M_p;
        vars.TargetPDB = (char *)0x3;
        vars.TargetCompilePDB = "sm_";
        vars.TargetVersionMajor = (char *)fatbinaryOutput._M_string_length;
        vars.TargetVersionMinor = fatbinaryOutput._M_dataplus._M_p;
        vars.Language = (char *)0x6;
        vars.AIXExports = ".cubin";
        views_03._M_len = 4;
        views_03._M_array = (iterator)&vars;
        cmCatViews_abi_cxx11_(&fatbinaryOutputRel,views_03);
        vars.CMTargetName = (char *)0x10;
        vars.CMTargetType = " -im=profile=sm_";
        vars.TargetPDB = (char *)fatbinaryOutput._M_string_length;
        vars.TargetCompilePDB = fatbinaryOutput._M_dataplus._M_p;
        vars.TargetVersionMajor = (char *)0x6;
        vars.TargetVersionMinor = ",file=";
        vars.Language = (char *)fatbinaryOutputRel._M_string_length;
        vars.AIXExports = fatbinaryOutputRel._M_dataplus._M_p;
        views_04._M_len = 4;
        views_04._M_array = (iterator)&vars;
        cmCatViews_abi_cxx11_(&linkFlags,views_04);
        std::__cxx11::string::_M_append((char *)&profiles,(ulong)linkFlags._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)linkFlags._M_dataplus._M_p != &linkFlags.field_2) {
          operator_delete(linkFlags._M_dataplus._M_p,
                          CONCAT71(linkFlags.field_2._M_allocated_capacity._1_7_,
                                   linkFlags.field_2._M_local_buf[0]) + 1);
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string_const&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &fatbinaryDepends,&fatbinaryOutputRel);
        pcVar4 = (this->super_cmCommonTargetGenerator).Makefile;
        flags._M_dataplus._M_p = (pointer)&flags.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&flags,"CMAKE_CUDA_DEVICE_LINKER","");
        psVar10 = cmMakefile::GetRequiredDefinition(pcVar4,&flags);
        pcVar3 = (psVar10->_M_dataplus)._M_p;
        pcVar5 = (char *)psVar10->_M_string_length;
        separator._M_str = " ";
        separator._M_len = 1;
        cmJoin(&compileCmd,&linkDeps,separator,(string_view)ZEXT816(0));
        vars.TargetPDB = (char *)0xa;
        vars.TargetCompilePDB = " -arch=sm_";
        vars.TargetVersionMajor = (char *)fatbinaryOutput._M_string_length;
        vars.TargetVersionMinor = fatbinaryOutput._M_dataplus._M_p;
        vars.Language = (char *)fatbinaryCommand._M_string_length;
        vars.AIXExports = fatbinaryCommand._M_dataplus._M_p;
        vars.Objects = (char *)0x7;
        vars.Target = " -o=$@ ";
        vars.LinkLibraries = (char *)compileCmd._M_string_length;
        vars.Source = compileCmd._M_dataplus._M_p;
        views_05._M_len = 6;
        views_05._M_array = (iterator)&vars;
        vars.CMTargetName = pcVar5;
        vars.CMTargetType = pcVar3;
        cmCatViews_abi_cxx11_(&linkFlags,views_05);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)compileCmd._M_dataplus._M_p != &compileCmd.field_2) {
          operator_delete(compileCmd._M_dataplus._M_p,compileCmd.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)flags._M_dataplus._M_p != &flags.field_2) {
          operator_delete(flags._M_dataplus._M_p,flags.field_2._M_allocated_capacity + 1);
        }
        pcVar6 = (this->BuildFileStream)._M_t.
                 super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                 .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
        vars.CMTargetName = (char *)&vars.TargetPDB;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&vars,linkFlags._M_dataplus._M_p,
                   linkFlags._M_dataplus._M_p + linkFlags._M_string_length);
        __l._M_len = 1;
        __l._M_array = (iterator)&vars;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&flags,__l,(allocator_type *)&compileCmd);
        cmLocalUnixMakefileGenerator3::WriteMakeRule
                  (this_02,(ostream *)pcVar6,(char *)0x0,&fatbinaryOutputRel,&linkDeps,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&flags,false,false);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&flags);
        if ((char **)vars.CMTargetName != &vars.TargetPDB) {
          operator_delete(vars.CMTargetName,(ulong)(vars.TargetPDB + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)linkFlags._M_dataplus._M_p != &linkFlags.field_2) {
          operator_delete(linkFlags._M_dataplus._M_p,
                          CONCAT71(linkFlags.field_2._M_allocated_capacity._1_7_,
                                   linkFlags.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)fatbinaryOutputRel._M_dataplus._M_p != &fatbinaryOutputRel.field_2) {
          operator_delete(fatbinaryOutputRel._M_dataplus._M_p,
                          fatbinaryOutputRel.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)fatbinaryOutput._M_dataplus._M_p != &fatbinaryOutput.field_2) {
          operator_delete(fatbinaryOutput._M_dataplus._M_p,
                          fatbinaryOutput.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)fatbinaryCommand._M_dataplus._M_p != &fatbinaryCommand.field_2) {
          operator_delete(fatbinaryCommand._M_dataplus._M_p,
                          CONCAT71(fatbinaryCommand.field_2._M_allocated_capacity._1_7_,
                                   fatbinaryCommand.field_2._M_local_buf[0]) + 1);
        }
        pbVar11 = pbVar11 + 1;
      } while (pbVar11 !=
               architectures.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    pcVar4 = (this->super_cmCommonTargetGenerator).Makefile;
    fatbinaryOutput._M_dataplus._M_p = (pointer)&fatbinaryOutput.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&fatbinaryOutput,"CMAKE_CUDA_FATBINARY","");
    psVar10 = cmMakefile::GetRequiredDefinition(pcVar4,&fatbinaryOutput);
    vars.CMTargetType = (psVar10->_M_dataplus)._M_p;
    vars.CMTargetName = (char *)psVar10->_M_string_length;
    vars.TargetPDB = &DAT_00000045;
    vars.TargetCompilePDB = " -64 -cmdline=--compile-only -compress-all -link --embedded-fatbin=$@";
    vars.TargetVersionMajor = (char *)profiles._M_string_length;
    vars.TargetVersionMinor = profiles._M_dataplus._M_p;
    views_06._M_len = 3;
    views_06._M_array = (iterator)&vars;
    cmCatViews_abi_cxx11_(&fatbinaryCommand,views_06);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)fatbinaryOutput._M_dataplus._M_p != &fatbinaryOutput.field_2) {
      operator_delete(fatbinaryOutput._M_dataplus._M_p,
                      fatbinaryOutput.field_2._M_allocated_capacity + 1);
    }
    vars.CMTargetName = (char *)objectDir._M_string_length;
    vars.CMTargetType = objectDir._M_dataplus._M_p;
    vars.TargetPDB = (char *)0x13;
    vars.TargetCompilePDB = "cmake_cuda_fatbin.h";
    views_07._M_len = 2;
    views_07._M_array = (iterator)&vars;
    cmCatViews_abi_cxx11_(&fatbinaryOutput,views_07);
    vars.CMTargetType = (psVar9->_M_dataplus)._M_p;
    vars.CMTargetName = (char *)psVar9->_M_string_length;
    vars.TargetPDB = (char *)relObjectDir._M_string_length;
    vars.TargetCompilePDB = relObjectDir._M_dataplus._M_p;
    vars.TargetVersionMajor = (char *)0x13;
    vars.TargetVersionMinor = "cmake_cuda_fatbin.h";
    views_08._M_len = 3;
    views_08._M_array = (iterator)&vars;
    cmCatViews_abi_cxx11_(&fatbinaryOutputRel,views_08);
    pcVar6 = (this->BuildFileStream)._M_t.
             super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
             .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
    vars.CMTargetName = (char *)&vars.TargetPDB;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&vars,fatbinaryCommand._M_dataplus._M_p,
               fatbinaryCommand._M_dataplus._M_p + fatbinaryCommand._M_string_length);
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)&vars;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&linkFlags,__l_00,(allocator_type *)&flags);
    cmLocalUnixMakefileGenerator3::WriteMakeRule
              (this_02,(ostream *)pcVar6,(char *)0x0,&fatbinaryOutputRel,&fatbinaryDepends,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&linkFlags,false,false);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&linkFlags);
    if ((char **)vars.CMTargetName != &vars.TargetPDB) {
      operator_delete(vars.CMTargetName,(ulong)(vars.TargetPDB + 1));
    }
    memset(&vars,0,0x150);
    psVar9 = cmGeneratorTarget::GetName_abi_cxx11_
                       ((this->super_cmCommonTargetGenerator).GeneratorTarget);
    vars.CMTargetName = (psVar9->_M_dataplus)._M_p;
    targetType = cmGeneratorTarget::GetType((this->super_cmCommonTargetGenerator).GeneratorTarget);
    psVar9 = cmState::GetTargetTypeName_abi_cxx11_(targetType);
    vars.CMTargetType = (psVar9->_M_dataplus)._M_p;
    vars.Language = "CUDA";
    vars.Object = (output->_M_dataplus)._M_p;
    vars.Fatbinary = fatbinaryOutput._M_dataplus._M_p;
    vars.RegisterFile = registerFile._M_dataplus._M_p;
    linkFlags._M_string_length = 0;
    linkFlags.field_2._M_local_buf[0] = '\0';
    linkFlags._M_dataplus._M_p = (pointer)&linkFlags.field_2;
    flags._M_dataplus._M_p = (pointer)&flags.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&flags,"CUDA","");
    GetDeviceLinkFlags(this,&linkFlags,&flags);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)flags._M_dataplus._M_p != &flags.field_2) {
      operator_delete(flags._M_dataplus._M_p,flags.field_2._M_allocated_capacity + 1);
    }
    vars.LinkFlags = linkFlags._M_dataplus._M_p;
    compileCmd._M_dataplus._M_p = (pointer)&compileCmd.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&compileCmd,"CUDA","");
    GetConfigName_abi_cxx11_((string *)&__an,this);
    local_c0._M_string_length = 0;
    local_c0.field_2._M_local_buf[0] = '\0';
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    cmCommonTargetGenerator::GetFlags
              (&flags,&this->super_cmCommonTargetGenerator,&compileCmd,(string *)&__an,&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,
                      CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                               local_c0.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__an._M_t != &local_2e8) {
      operator_delete(__an._M_t,local_2e8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)compileCmd._M_dataplus._M_p != &compileCmd.field_2) {
      operator_delete(compileCmd._M_dataplus._M_p,compileCmd.field_2._M_allocated_capacity + 1);
    }
    vars.Flags = flags._M_dataplus._M_p;
    __an._M_t = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_2e8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&__an,"CMAKE_CUDA_DEVICE_LINK_COMPILE","");
    GetLinkRule(&compileCmd,this,(string *)&__an);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__an._M_t != &local_2e8) {
      operator_delete(__an._M_t,local_2e8._M_allocated_capacity + 1);
    }
    iVar8 = (*(this_02->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator
              [5])();
    this_03 = (cmRulePlaceholderExpander *)CONCAT44(extraout_var,iVar8);
    cmRulePlaceholderExpander::ExpandRuleVariables(this_03,this_00,&compileCmd,&vars);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)commands,
               &compileCmd);
    pcVar6 = (this->BuildFileStream)._M_t.
             super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
             .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
    __an._M_t = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_2e8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__an,fatbinaryOutputRel._M_dataplus._M_p,
               fatbinaryOutputRel._M_dataplus._M_p + fatbinaryOutputRel._M_string_length);
    __l_01._M_len = 1;
    __l_01._M_array = (iterator)&__an;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_c0,__l_01,&local_3a9);
    cmLocalUnixMakefileGenerator3::WriteMakeRule
              (this_02,(ostream *)pcVar6,(char *)0x0,output,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_c0,commands,false,false);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__an._M_t != &local_2e8) {
      operator_delete(__an._M_t,local_2e8._M_allocated_capacity + 1);
    }
    pbVar11 = cleanFiles.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    this_01 = &this->CleanFiles;
    __an._M_t = &this_01->_M_t;
    if (cleanFiles.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        cleanFiles.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar15 = cleanFiles.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::
        _M_insert_unique_<std::__cxx11::string&,std::_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::_Alloc_node>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)this_01,(const_iterator)&(this->CleanFiles)._M_t._M_impl.super__Rb_tree_header
                   ,pbVar15,&__an);
        pbVar15 = pbVar15 + 1;
      } while (pbVar15 != pbVar11);
    }
    (*(this_03->super_cmPlaceholderExpander)._vptr_cmPlaceholderExpander[1])(this_03);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)compileCmd._M_dataplus._M_p != &compileCmd.field_2) {
      operator_delete(compileCmd._M_dataplus._M_p,compileCmd.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)flags._M_dataplus._M_p != &flags.field_2) {
      operator_delete(flags._M_dataplus._M_p,flags.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)linkFlags._M_dataplus._M_p != &linkFlags.field_2) {
      operator_delete(linkFlags._M_dataplus._M_p,
                      CONCAT71(linkFlags.field_2._M_allocated_capacity._1_7_,
                               linkFlags.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)fatbinaryOutputRel._M_dataplus._M_p != &fatbinaryOutputRel.field_2) {
      operator_delete(fatbinaryOutputRel._M_dataplus._M_p,
                      fatbinaryOutputRel.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)fatbinaryOutput._M_dataplus._M_p != &fatbinaryOutput.field_2) {
      operator_delete(fatbinaryOutput._M_dataplus._M_p,
                      fatbinaryOutput.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)fatbinaryCommand._M_dataplus._M_p != &fatbinaryCommand.field_2) {
      operator_delete(fatbinaryCommand._M_dataplus._M_p,
                      CONCAT71(fatbinaryCommand.field_2._M_allocated_capacity._1_7_,
                               fatbinaryCommand.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)registerFile._M_dataplus._M_p != &registerFile.field_2) {
      operator_delete(registerFile._M_dataplus._M_p,registerFile.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&fatbinaryDepends);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)profiles._M_dataplus._M_p != &profiles.field_2) {
      operator_delete(profiles._M_dataplus._M_p,
                      CONCAT71(profiles.field_2._M_allocated_capacity._1_7_,
                               profiles.field_2._M_local_buf[0]) + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&cleanFiles);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)relObjectDir._M_dataplus._M_p != &relObjectDir.field_2) {
      operator_delete(relObjectDir._M_dataplus._M_p,relObjectDir.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)objectDir._M_dataplus._M_p != &objectDir.field_2) {
      operator_delete(objectDir._M_dataplus._M_p,
                      CONCAT44(objectDir.field_2._M_allocated_capacity._4_4_,
                               objectDir.field_2._M_allocated_capacity._0_4_) + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&linkDeps);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&architectures);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)architecturesStr._M_dataplus._M_p != &architecturesStr.field_2) {
    operator_delete(architecturesStr._M_dataplus._M_p,
                    architecturesStr.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmMakefileTargetGenerator::WriteDeviceLinkRule(
  std::vector<std::string>& commands, const std::string& output)
{
  std::string architecturesStr =
    this->GeneratorTarget->GetSafeProperty("CUDA_ARCHITECTURES");

  if (cmIsOff(architecturesStr)) {
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR,
                                 "CUDA_SEPARABLE_COMPILATION on Clang "
                                 "requires CUDA_ARCHITECTURES to be set.");
    return;
  }

  cmLocalUnixMakefileGenerator3* localGen{ this->LocalGenerator };
  std::vector<std::string> architectures = cmExpandedList(architecturesStr);
  std::string const& relPath = localGen->GetHomeRelativeOutputPath();

  // Ensure there are no duplicates.
  const std::vector<std::string> linkDeps = [&]() -> std::vector<std::string> {
    std::vector<std::string> deps;
    this->AppendTargetDepends(deps, true);
    this->GeneratorTarget->GetLinkDepends(deps, this->GetConfigName(), "CUDA");

    for (std::string const& obj : this->Objects) {
      deps.emplace_back(cmStrCat(relPath, obj));
    }

    std::unordered_set<std::string> depsSet(deps.begin(), deps.end());
    deps.clear();
    std::copy(depsSet.begin(), depsSet.end(), std::back_inserter(deps));
    return deps;
  }();

  const std::string objectDir = this->GeneratorTarget->ObjectDirectory;
  const std::string relObjectDir =
    localGen->MaybeRelativeToCurBinDir(objectDir);

  // Construct a list of files associated with this executable that
  // may need to be cleaned.
  std::vector<std::string> cleanFiles;
  cleanFiles.push_back(localGen->MaybeRelativeToCurBinDir(output));

  std::string profiles;
  std::vector<std::string> fatbinaryDepends;
  std::string const registerFile =
    cmStrCat(objectDir, "cmake_cuda_register.h");

  // Link device code for each architecture.
  for (const std::string& architectureKind : architectures) {
    std::string registerFileCmd;

    // The generated register file contains macros that when expanded
    // register the device routines. Because the routines are the same for
    // all architectures the register file will be the same too. Thus
    // generate it only on the first invocation to reduce overhead.
    if (fatbinaryDepends.empty()) {
      std::string const registerFileRel =
        cmStrCat(relPath, relObjectDir, "cmake_cuda_register.h");
      registerFileCmd =
        cmStrCat(" --register-link-binaries=", registerFileRel);
      cleanFiles.push_back(registerFileRel);
    }

    // Clang always generates real code, so strip the specifier.
    const std::string architecture =
      architectureKind.substr(0, architectureKind.find('-'));
    const std::string cubin =
      cmStrCat(objectDir, "sm_", architecture, ".cubin");

    profiles += cmStrCat(" -im=profile=sm_", architecture, ",file=", cubin);
    fatbinaryDepends.emplace_back(cubin);

    std::string command = cmStrCat(
      this->Makefile->GetRequiredDefinition("CMAKE_CUDA_DEVICE_LINKER"),
      " -arch=sm_", architecture, registerFileCmd, " -o=$@ ",
      cmJoin(linkDeps, " "));

    localGen->WriteMakeRule(*this->BuildFileStream, nullptr, cubin, linkDeps,
                            { command }, false);
  }

  // Combine all architectures into a single fatbinary.
  const std::string fatbinaryCommand =
    cmStrCat(this->Makefile->GetRequiredDefinition("CMAKE_CUDA_FATBINARY"),
             " -64 -cmdline=--compile-only -compress-all -link "
             "--embedded-fatbin=$@",
             profiles);
  const std::string fatbinaryOutput =
    cmStrCat(objectDir, "cmake_cuda_fatbin.h");
  const std::string fatbinaryOutputRel =
    cmStrCat(relPath, relObjectDir, "cmake_cuda_fatbin.h");

  localGen->WriteMakeRule(*this->BuildFileStream, nullptr, fatbinaryOutputRel,
                          fatbinaryDepends, { fatbinaryCommand }, false);

  // Compile the stub that registers the kernels and contains the
  // fatbinaries.
  cmRulePlaceholderExpander::RuleVariables vars;
  vars.CMTargetName = this->GetGeneratorTarget()->GetName().c_str();
  vars.CMTargetType =
    cmState::GetTargetTypeName(this->GetGeneratorTarget()->GetType()).c_str();

  vars.Language = "CUDA";
  vars.Object = output.c_str();
  vars.Fatbinary = fatbinaryOutput.c_str();
  vars.RegisterFile = registerFile.c_str();

  std::string linkFlags;
  this->GetDeviceLinkFlags(linkFlags, "CUDA");
  vars.LinkFlags = linkFlags.c_str();

  std::string flags = this->GetFlags("CUDA", this->GetConfigName());
  vars.Flags = flags.c_str();

  std::string compileCmd = this->GetLinkRule("CMAKE_CUDA_DEVICE_LINK_COMPILE");
  std::unique_ptr<cmRulePlaceholderExpander> rulePlaceholderExpander(
    localGen->CreateRulePlaceholderExpander());
  rulePlaceholderExpander->ExpandRuleVariables(localGen, compileCmd, vars);

  commands.emplace_back(compileCmd);
  localGen->WriteMakeRule(*this->BuildFileStream, nullptr, output,
                          { fatbinaryOutputRel }, commands, false);

  // Clean all the possible executable names and symlinks.
  this->CleanFiles.insert(cleanFiles.begin(), cleanFiles.end());
}